

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

bool __thiscall Process::join(Process *this,uint32 *exitCode)

{
  uint32 uVar1;
  int *piVar2;
  bool bVar3;
  int status;
  undefined4 local_1c;
  
  if (this->pid == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    bVar3 = false;
  }
  else {
    uVar1 = waitpid(this->pid,&local_1c,0);
    bVar3 = uVar1 == this->pid;
    if (bVar3) {
      *exitCode = (uint)local_1c._1_1_;
      if (this->fdStdOutRead != 0) {
        ::close(this->fdStdOutRead);
        this->fdStdOutRead = 0;
      }
      if (this->fdStdErrRead != 0) {
        ::close(this->fdStdErrRead);
        this->fdStdErrRead = 0;
      }
      if (this->fdStdInWrite != 0) {
        ::close(this->fdStdInWrite);
        this->fdStdInWrite = 0;
      }
      this->pid = 0;
    }
  }
  return bVar3;
}

Assistant:

bool Process::join(uint32& exitCode)
{
#ifdef _WIN32
  if(hProcess == INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }
  DWORD dwExitCode = 0;
  if(!GetExitCodeProcess(hProcess, &dwExitCode))
    return false;
  if(dwExitCode == STILL_ACTIVE)
  {
    if(WaitForSingleObject(hProcess, INFINITE) != WAIT_OBJECT_0)
      return false;
    if(!GetExitCodeProcess(hProcess, &dwExitCode))
      return false;
  }
  CloseHandle((HANDLE)hProcess);
  hProcess = INVALID_HANDLE_VALUE;
  exitCode = (uint32)dwExitCode;
  if(hStdOutRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdOutRead);
    hStdOutRead = INVALID_HANDLE_VALUE;
  }
  if(hStdErrRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdErrRead);
    hStdErrRead = INVALID_HANDLE_VALUE;
  }
  if(hStdInWrite != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdInWrite);
    hStdInWrite = INVALID_HANDLE_VALUE;
  }
  pid = 0;
  return true;
#else
  if(!pid)
  {
    errno = EINVAL;
    return false;
  }
  int status;
  if(waitpid(pid, &status, 0) != (pid_t)pid)
    return false;
  exitCode = WEXITSTATUS(status);
  if(fdStdOutRead)
  {
    ::close(fdStdOutRead);
    fdStdOutRead = 0;
  }
  if(fdStdErrRead)
  {
    ::close(fdStdErrRead);
    fdStdErrRead = 0;
  }
  if(fdStdInWrite)
  {
    ::close(fdStdInWrite);
    fdStdInWrite = 0;
  }
  pid = 0;
  return true;
#endif
}